

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_MockSupportSetBoolData_Test::testBody
          (TEST_MockSupport_c_MockSupportSetBoolData_Test *this)

{
  undefined4 uVar1;
  MockSupport_c *pMVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  bool bVar7;
  MockValue_c MVar8;
  SimpleString local_70 [2];
  SimpleString local_50;
  MockValueType_c local_40;
  anon_union_8_15_d77b29c0_for_value local_38;
  MockValueType_c local_30;
  anon_union_8_15_d77b29c0_for_value local_28;
  MockValueType_c local_20;
  anon_union_8_15_d77b29c0_for_value local_18;
  TEST_MockSupport_c_MockSupportSetBoolData_Test *local_10;
  TEST_MockSupport_c_MockSupportSetBoolData_Test *this_local;
  
  local_10 = this;
  pMVar2 = mock_c();
  (*pMVar2->setBoolData)("boolean",1);
  pMVar2 = mock_c();
  MVar8 = (*pMVar2->getData)("boolean");
  local_20 = MVar8.type;
  local_18._0_4_ = MVar8.value._0_4_;
  local_18.longIntValue = MVar8.value.longIntValue;
  if (local_18._0_4_ == 1) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0x231,pTVar6);
  }
  else {
    pMVar2 = mock_c();
    MVar8 = (*pMVar2->getData)("boolean");
    local_30 = MVar8.type;
    local_28._0_4_ = MVar8.value._0_4_;
    uVar1 = local_28._0_4_;
    local_28.longIntValue = MVar8.value.longIntValue;
    pMVar2 = mock_c();
    MVar8 = (*pMVar2->getData)("boolean");
    local_40 = MVar8.type;
    local_38._0_4_ = MVar8.value._0_4_;
    bVar7 = uVar1 != local_38._0_4_;
    local_38.longIntValue = MVar8.value.longIntValue;
    if (bVar7) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1c])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                 ,0x231);
    }
    pUVar3 = UtestShell::getCurrent();
    ::StringFrom((int)&local_50);
    pcVar4 = SimpleString::asCharString(&local_50);
    pMVar2 = mock_c();
    (*pMVar2->getData)("boolean");
    ::StringFrom((int)local_70);
    pcVar5 = SimpleString::asCharString(local_70);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0x231,pTVar6);
    SimpleString::~SimpleString(local_70);
    SimpleString::~SimpleString(&local_50);
  }
  return;
}

Assistant:

TEST(MockSupport_c, MockSupportSetBoolData)
{
    mock_c()->setBoolData("boolean", 1);
    CHECK_EQUAL(1, mock_c()->getData("boolean").value.boolValue);
}